

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::PrintUTF8ErrorLog
               (char *field_name,char *operation_str,bool emit_stacktrace)

{
  LogMessage *pLVar1;
  undefined1 local_a8 [8];
  string stacktrace;
  undefined1 local_50 [8];
  string quoted_field_name;
  
  stacktrace._M_dataplus._M_p = (pointer)0x0;
  stacktrace._M_string_length._0_1_ = 0;
  local_a8 = (undefined1  [8])&stacktrace._M_string_length;
  local_50 = (undefined1  [8])&quoted_field_name._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  if (field_name != (char *)0x0) {
    StringPrintf_abi_cxx11_((string *)((long)&stacktrace.field_2 + 8)," \'%s\'",field_name);
    std::__cxx11::string::operator=
              ((string *)local_50,(string *)(stacktrace.field_2._M_local_buf + 8));
    if ((undefined1 *)stacktrace.field_2._8_8_ != &stack0xffffffffffffff88) {
      operator_delete((void *)stacktrace.field_2._8_8_);
    }
  }
  LogMessage::LogMessage
            ((LogMessage *)((long)&stacktrace.field_2 + 8),LOGLEVEL_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/wire_format_lite.cc"
             ,0x241);
  pLVar1 = LogMessage::operator<<((LogMessage *)((long)&stacktrace.field_2 + 8),"String field");
  pLVar1 = LogMessage::operator<<(pLVar1,(string *)local_50);
  pLVar1 = LogMessage::operator<<(pLVar1," contains invalid ");
  pLVar1 = LogMessage::operator<<(pLVar1,"UTF-8 data when ");
  pLVar1 = LogMessage::operator<<(pLVar1,operation_str);
  pLVar1 = LogMessage::operator<<(pLVar1," a protocol ");
  pLVar1 = LogMessage::operator<<
                     (pLVar1,"buffer. Use the \'bytes\' type if you intend to send raw ");
  pLVar1 = LogMessage::operator<<(pLVar1,"bytes. ");
  pLVar1 = LogMessage::operator<<(pLVar1,(string *)local_a8);
  LogFinisher::operator=((LogFinisher *)(quoted_field_name.field_2._M_local_buf + 0xf),pLVar1);
  LogMessage::~LogMessage((LogMessage *)((long)&stacktrace.field_2 + 8));
  if (local_50 != (undefined1  [8])&quoted_field_name._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (local_a8 != (undefined1  [8])&stacktrace._M_string_length) {
    operator_delete((void *)local_a8);
  }
  return;
}

Assistant:

void PrintUTF8ErrorLog(const char* field_name, const char* operation_str,
                       bool emit_stacktrace) {
  std::string stacktrace;
  std::string quoted_field_name = "";
  if (field_name != nullptr) {
    quoted_field_name = StringPrintf(" '%s'", field_name);
  }
  GOOGLE_LOG(ERROR) << "String field" << quoted_field_name << " contains invalid "
             << "UTF-8 data when " << operation_str << " a protocol "
             << "buffer. Use the 'bytes' type if you intend to send raw "
             << "bytes. " << stacktrace;
}